

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O2

void __thiscall
duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>::BuildRun
          (MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL> *this,
          idx_t level_idx,idx_t run_idx)

{
  ulong uVar1;
  pointer puVar2;
  pointer puVar3;
  value_type vVar4;
  idx_t l;
  reference pvVar5;
  reference pvVar6;
  reference this_00;
  ulong uVar7;
  ulong uVar8;
  const_reference pvVar9;
  reference pvVar10;
  ulong uVar11;
  ulong uVar12;
  RunElement *insert_val;
  ulong uVar13;
  size_type sVar14;
  idx_t child_run;
  long lVar15;
  idx_t slot_idx;
  idx_t j;
  long lVar16;
  RunElement RVar17;
  ulong local_670;
  RunElement local_658;
  reference local_640;
  reference local_638;
  RunElement local_630;
  array<std::pair<unsigned_long,_unsigned_long>,_32UL> bounds;
  RunElements players;
  Games games;
  
  pvVar5 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
           ::get<true>(&this->tree,level_idx);
  pvVar6 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
           ::get<true>(&this->tree,level_idx);
  local_638 = pvVar6;
  this_00 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
            ::get<true>(&this->tree,level_idx - 1);
  uVar7 = 1;
  uVar8 = 0x20;
  uVar13 = uVar7;
  for (; uVar11 = uVar8, uVar7 < level_idx; uVar7 = uVar7 + 1) {
    uVar8 = uVar11 << 5;
    uVar13 = uVar11;
  }
  uVar7 = (long)(pvVar5->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar5->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  local_658.first._0_4_ = 0xffffffff;
  local_658.first._4_4_ = 0xffffffff;
  local_658.second._0_4_ = 0xffffffff;
  local_658.second._4_4_ = 0xffffffff;
  lVar16 = 0;
  local_640 = pvVar5;
  switchD_004a0b15::default(&bounds,0,0x200);
  switchD_004a0b15::default(&players,0,0x200);
  sVar14 = uVar11 * run_idx;
  for (lVar15 = 0; lVar15 != 0x20; lVar15 = lVar15 + 1) {
    uVar8 = uVar7;
    if (sVar14 < uVar7) {
      uVar8 = sVar14;
    }
    uVar1 = uVar13 + sVar14;
    uVar12 = uVar7;
    if (uVar1 < uVar7) {
      uVar12 = uVar1;
    }
    *(ulong *)((long)&bounds._M_elems[0].first + lVar16) = uVar8;
    *(ulong *)((long)&bounds._M_elems[0].second + lVar16) = uVar12;
    if (uVar8 == uVar12) {
      *(undefined4 *)((long)&players._M_elems[0].first + lVar16) = 0xffffffff;
      *(undefined4 *)((long)&players._M_elems[0].first + lVar16 + 4) = 0xffffffff;
      *(undefined4 *)((long)&players._M_elems[0].second + lVar16) = 0xffffffff;
      *(undefined4 *)((long)&players._M_elems[0].second + lVar16 + 4) = 0xffffffff;
    }
    else {
      pvVar9 = vector<unsigned_long,_true>::get<true>(&this_00->first,sVar14);
      *(value_type *)((long)&players._M_elems[0].first + lVar16) = *pvVar9;
      *(long *)((long)&players._M_elems[0].second + lVar16) = lVar15;
    }
    lVar16 = lVar16 + 0x10;
    sVar14 = uVar1;
  }
  switchD_004a0b15::default(&games,0,0x1f0);
  sVar14 = run_idx * ((uVar11 >> 5) + 2) * 0x20;
  RVar17 = StartGames(this,&games,&players,&local_658);
  local_670 = uVar11 * run_idx;
  while( true ) {
    slot_idx = RVar17.second;
    puVar2 = (local_638->second).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (local_638->second).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((RVar17.first == CONCAT44(local_658.first._4_4_,(undefined4)local_658.first)) &&
       (slot_idx == CONCAT44(local_658.second._4_4_,(undefined4)local_658.second))) break;
    if ((puVar2 != puVar3) && ((local_670 & 0x1f) == 0)) {
      for (lVar15 = 0; lVar15 != 0x200; lVar15 = lVar15 + 0x10) {
        vVar4 = *(value_type *)((long)&bounds._M_elems[0].first + lVar15);
        pvVar10 = vector<unsigned_long,_true>::get<true>(&pvVar6->second,sVar14);
        *pvVar10 = vVar4;
        sVar14 = sVar14 + 1;
      }
    }
    pvVar10 = vector<unsigned_long,_true>::get<true>(&local_640->first,local_670);
    *pvVar10 = RVar17.first;
    uVar7 = bounds._M_elems[slot_idx].first + 1;
    bounds._M_elems[slot_idx].first = uVar7;
    if (uVar7 < bounds._M_elems[slot_idx].second) {
      pvVar9 = vector<unsigned_long,_true>::get<true>(&this_00->first,uVar7);
      local_630.first = *pvVar9;
      insert_val = &local_630;
      local_630.second = slot_idx;
    }
    else {
      insert_val = &local_658;
    }
    RVar17 = ReplayGames(this,&games,slot_idx,insert_val);
    local_670 = local_670 + 1;
  }
  if (puVar2 != puVar3) {
    for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
      for (lVar16 = 0; lVar16 != 0x200; lVar16 = lVar16 + 0x10) {
        vVar4 = *(value_type *)((long)&bounds._M_elems[0].first + lVar16);
        pvVar10 = vector<unsigned_long,_true>::get<true>(&pvVar6->second,sVar14);
        *pvVar10 = vVar4;
        sVar14 = sVar14 + 1;
      }
    }
  }
  LOCK();
  (this->build_complete).super___atomic_base<unsigned_long>._M_i =
       (this->build_complete).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void MergeSortTree<E, O, CMP, F, C>::BuildRun(idx_t level_idx, idx_t run_idx) {
	//	Create each parent run by merging the child runs using a tournament tree
	// 	https://en.wikipedia.org/wiki/K-way_merge_algorithm
	const auto fanout = F;
	const auto cascading = C;

	auto &elements = tree[level_idx].first;
	auto &cascades = tree[level_idx].second;
	const auto &child_level = tree[level_idx - 1];
	const auto count = elements.size();

	idx_t child_run_length = 1;
	auto run_length = child_run_length * fanout;
	for (idx_t l = 1; l < level_idx; ++l) {
		child_run_length = run_length;
		run_length *= fanout;
	}

	const RunElement SENTINEL(MergeSortTraits<ElementType>::SENTINEL(), MergeSortTraits<idx_t>::SENTINEL());

	//	Position markers for scanning the children.
	using Bounds = pair<OffsetType, OffsetType>;
	array<Bounds, fanout> bounds;
	//	Start with first element of each (sorted) child run
	RunElements players;
	const auto child_base = run_idx * run_length;
	for (idx_t child_run = 0; child_run < fanout; ++child_run) {
		const auto child_idx = child_base + child_run * child_run_length;
		bounds[child_run] = {OffsetType(MinValue<idx_t>(child_idx, count)),
		                     OffsetType(MinValue<idx_t>(child_idx + child_run_length, count))};
		if (bounds[child_run].first != bounds[child_run].second) {
			players[child_run] = {child_level.first[child_idx], child_run};
		} else {
			//	Empty child
			players[child_run] = SENTINEL;
		}
	}

	//	Play the first round and extract the winner
	Games games;
	auto element_idx = child_base;
	auto cascade_idx = fanout * run_idx * (run_length / cascading + 2);
	auto winner = StartGames(games, players, SENTINEL);
	while (winner != SENTINEL) {
		// Add fractional cascading pointers
		// if we are on a fraction boundary
		if (!cascades.empty() && element_idx % cascading == 0) {
			for (idx_t i = 0; i < fanout; ++i) {
				cascades[cascade_idx++] = bounds[i].first;
			}
		}

		//	Insert new winner element into the current run
		elements[element_idx++] = winner.first;
		const auto child_run = winner.second;
		auto &child_idx = bounds[child_run].first;
		++child_idx;

		//	Move to the next entry in the child run (if any)
		if (child_idx < bounds[child_run].second) {
			winner = ReplayGames(games, child_run, {child_level.first[child_idx], child_run});
		} else {
			winner = ReplayGames(games, child_run, SENTINEL);
		}
	}

	// Add terminal cascade pointers to the end
	if (!cascades.empty()) {
		for (idx_t j = 0; j < 2; ++j) {
			for (idx_t i = 0; i < fanout; ++i) {
				cascades[cascade_idx++] = bounds[i].first;
			}
		}
	}

	++build_complete;
}